

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,istream *in,int32_t k,
          real threshold)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  Meter meter;
  undefined1 local_88 [32];
  undefined1 local_68 [24];
  _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_50;
  
  local_88 = ZEXT1632(ZEXT816(0) << 0x40);
  _Stack_50._M_rehash_policy._4_4_ = 0;
  local_68._16_8_ = 0;
  local_68._0_16_ = ZEXT816(0) << 0x40;
  _Stack_50._M_buckets = &_Stack_50._M_single_bucket;
  _Stack_50._M_bucket_count = 1;
  _Stack_50._40_16_ = ZEXT416(0) << 0x40;
  _Stack_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_50._M_element_count = 0;
  _Stack_50._M_rehash_policy._M_max_load_factor = 1.0;
  test(this,in,k,threshold,(Meter *)local_88);
  uVar1 = local_68._16_8_;
  dVar2 = Meter::precision((Meter *)local_88);
  dVar3 = Meter::recall((Meter *)local_88);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl = dVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = uVar1;
  std::
  _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&_Stack_50);
  if ((pointer)local_88._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._24_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter;
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}